

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshTopology::Create(ON_MeshTopology *this)

{
  ON_MeshFaceSide *pOVar1;
  undefined4 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  ON_MeshFace *pOVar12;
  ON_MeshFaceSide *pOVar13;
  ON_MeshFaceSide *pOVar14;
  uint uVar15;
  int iVar16;
  ulong new_capacity;
  memchunk *pmVar17;
  uint *puVar18;
  ON_MeshTopologyVertex *pOVar19;
  ON_MeshTopologyEdge *pOVar20;
  void *__s;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  memchunk *pmVar24;
  int *piVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  ON_MeshTopologyFace *pOVar31;
  int iVar32;
  uint uVar33;
  size_t sVar34;
  bool bVar35;
  ON_MeshFaceSide *e;
  ON_Workspace ws;
  ON_MeshFaceSide *local_48;
  ON_Workspace local_40;
  
  bVar35 = true;
  if (this->m_b32IsValid != 1) {
    iVar3 = this->m_b32IsValid;
    if (iVar3 == 0) {
      this->m_b32IsValid = -1;
    }
    iVar32 = iVar3;
    if (iVar3 + 1U < 2) {
      Destroy(this);
      iVar4 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      sVar34 = (size_t)iVar4;
      if (sVar34 == 0) {
        iVar32 = 0;
      }
      else {
        uVar5 = (this->m_mesh->m_F).m_count;
        new_capacity = (ulong)uVar5;
        if ((iVar4 < 1) ||
           (pmVar17 = (memchunk *)onmalloc(sVar34 * 4 + 8), pmVar17 == (memchunk *)0x0)) {
          pmVar24 = (memchunk *)0x0;
        }
        else {
          pmVar17->next = this->m_memchunk;
          pmVar24 = pmVar17 + 1;
          this->m_memchunk = pmVar17;
        }
        ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,sVar34);
        if ((-1 < iVar4) && (iVar4 <= (this->m_topv_map).m_capacity)) {
          (this->m_topv_map).m_count = iVar4;
        }
        iVar32 = 0;
        puVar18 = ON_Mesh::GetVertexLocationIds
                            (this->m_mesh,0,(uint *)(this->m_topv_map).m_a,(uint *)pmVar24);
        if (puVar18 == (uint *)0x0) {
          Destroy(this);
        }
        else {
          iVar32 = (this->m_topv_map).m_a[*(uint *)((long)pmVar24 + sVar34 * 4 + -4)];
          ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,sVar34);
          if ((-1 < iVar4) && (iVar4 <= (this->m_topv_map).m_capacity)) {
            (this->m_topv_map).m_count = iVar4;
          }
          ON_SimpleArray<ON_MeshTopologyVertex>::SetCapacity(&this->m_topv,(long)iVar32 + 1);
          if (0 < iVar4) {
            iVar32 = 0;
            do {
              iVar6 = (this->m_topv).m_count;
              pOVar19 = ON_SimpleArray<ON_MeshTopologyVertex>::AppendNew(&this->m_topv);
              lVar23 = (long)iVar32;
              pOVar19->m_vi = (int *)((long)&pmVar24->next + lVar23 * 4);
              iVar29 = iVar32;
              iVar10 = iVar32 + 1;
              if (iVar32 + 1 < iVar4) {
                iVar10 = iVar4;
              }
              do {
                iVar30 = iVar10;
                if ((long)sVar34 <= lVar23 + 1) break;
                lVar28 = lVar23 * 4;
                iVar30 = iVar29 + 1;
                iVar29 = iVar30;
                lVar23 = lVar23 + 1;
              } while (iVar6 == (this->m_topv_map).m_a[*(uint *)((long)&pmVar24->next + lVar28 + 4)]
                      );
              pOVar19->m_v_count = iVar30 - iVar32;
              iVar32 = iVar30;
            } while (iVar30 < iVar4);
          }
          uVar7 = (this->m_topv).m_count;
          iVar32 = 1;
          if (((1 < (long)(int)uVar7) && (iVar32 = 1, 0 < (int)uVar5)) && (0 < iVar4)) {
            ON_Workspace::ON_Workspace(&local_40);
            local_48 = (ON_MeshFaceSide *)
                       ON_Workspace::GetMemory(&local_40,(ulong)(uVar5 * 4) * 0x14);
            uVar15 = ON_Mesh::GetMeshFaceSideList
                               (this->m_mesh,(uint *)(this->m_topv_map).m_a,&local_48);
            pOVar14 = local_48;
            if (0 < (int)uVar15) {
              uVar21 = (ulong)uVar15;
              ON_MeshFaceSide::SortByVertexIndex(local_48,uVar21);
              uVar26 = 0;
              uVar22 = 0;
              do {
                lVar23 = (long)(int)uVar26;
                pOVar1 = pOVar14 + lVar23;
                pOVar13 = pOVar14 + lVar23;
                uVar9 = uVar26 + 1;
                if ((int)(uVar26 + 1) < (int)uVar15) {
                  uVar9 = uVar15;
                }
                puVar18 = pOVar14[lVar23 + 1].m_vi + 1;
                do {
                  lVar23 = lVar23 + 1;
                  uVar33 = uVar9;
                  if ((long)uVar21 <= lVar23) break;
                  if (((ON_MeshFaceSide *)(puVar18 + -1))->m_vi[0] != pOVar1->m_vi[0]) {
                    uVar33 = uVar26 + 1;
                    break;
                  }
                  uVar26 = uVar26 + 1;
                  uVar8 = *puVar18;
                  puVar18 = puVar18 + 5;
                  uVar33 = uVar26;
                } while (uVar8 == pOVar13->m_vi[1]);
                uVar26 = uVar33;
                uVar22 = uVar22 + 1;
              } while ((int)uVar26 < (int)uVar15);
              ON_SimpleArray<ON_MeshTopologyEdge>::SetCapacity(&this->m_tope,(ulong)uVar22);
              pmVar17 = (memchunk *)onmalloc(uVar21 * 4 + 8);
              uVar22 = 0;
              if (pmVar17 == (memchunk *)0x0) {
                pmVar24 = (memchunk *)0x0;
              }
              else {
                pmVar17->next = this->m_memchunk;
                pmVar24 = pmVar17 + 1;
                this->m_memchunk = pmVar17;
              }
              do {
                pOVar20 = ON_SimpleArray<ON_MeshTopologyEdge>::AppendNew(&this->m_tope);
                uVar26 = pOVar14[(int)uVar22].m_vi[0];
                pOVar20->m_topvi[0] = uVar26;
                uVar9 = pOVar14[(int)uVar22].m_vi[1];
                pOVar20->m_topvi[1] = uVar9;
                pOVar20->m_topfi = (int *)pmVar24;
                pOVar20->m_topf_count = 0;
                *(uint *)&pmVar24->next = pOVar14[(int)uVar22].m_fi;
                pOVar20->m_topf_count = pOVar20->m_topf_count + 1;
                pmVar24 = (memchunk *)((long)&pmVar24->next + 4);
                uVar33 = uVar22 + 1;
                uVar22 = uVar33;
                if ((int)uVar33 < (int)uVar15) {
                  puVar18 = &pOVar14[(int)uVar33].m_fi;
                  lVar23 = 0;
                  do {
                    if ((((ON_MeshFaceSide *)(puVar18 + -2))->m_vi[0] != uVar26) ||
                       (puVar18[-1] != uVar9)) {
                      uVar22 = uVar33 - (int)lVar23;
                      break;
                    }
                    *(uint *)&pmVar24->next = *puVar18;
                    pOVar20->m_topf_count = pOVar20->m_topf_count + 1;
                    pmVar24 = (memchunk *)((long)&pmVar24->next + 4);
                    lVar23 = lVar23 + -1;
                    puVar18 = puVar18 + 5;
                    uVar22 = uVar15;
                  } while ((long)(int)uVar33 - uVar21 != lVar23);
                }
              } while ((int)uVar22 < (int)uVar15);
              uVar15 = (this->m_tope).m_count;
              uVar21 = (ulong)uVar15;
              sVar34 = (long)(int)uVar7 * 4;
              __s = onmalloc(sVar34);
              memset(__s,0,sVar34);
              if (0 < (int)uVar15) {
                pOVar20 = (this->m_tope).m_a;
                lVar23 = 0;
                do {
                  piVar25 = (int *)((long)__s + (long)*(int *)((long)pOVar20->m_topvi + lVar23) * 4)
                  ;
                  *piVar25 = *piVar25 + 1;
                  piVar25 = (int *)((long)__s +
                                   (long)*(int *)((long)pOVar20->m_topvi + lVar23 + 4) * 4);
                  *piVar25 = *piVar25 + 1;
                  lVar23 = lVar23 + 0x18;
                } while (uVar21 * 0x18 != lVar23);
              }
              if (((int)uVar15 < 1) ||
                 (pmVar17 = (memchunk *)onmalloc(uVar21 * 8 + 8), pmVar17 == (memchunk *)0x0)) {
                pmVar24 = (memchunk *)0x0;
              }
              else {
                pmVar17->next = this->m_memchunk;
                pmVar24 = pmVar17 + 1;
                this->m_memchunk = pmVar17;
              }
              pOVar19 = (this->m_topv).m_a;
              uVar27 = 1;
              if (1 < (int)uVar7) {
                uVar27 = (ulong)uVar7;
              }
              lVar23 = 0;
              do {
                iVar32 = *(int *)((long)__s + lVar23);
                if (0 < (long)iVar32) {
                  (&pOVar19->m_topei)[lVar23] = (int *)pmVar24;
                  pmVar24 = (memchunk *)((long)&pmVar24->next + (long)iVar32 * 4);
                }
                lVar23 = lVar23 + 4;
              } while (uVar27 * 4 != lVar23);
              onfree(__s);
              if (0 < (int)uVar15) {
                pOVar19 = (this->m_topv).m_a;
                piVar25 = ((this->m_tope).m_a)->m_topvi + 1;
                uVar27 = 0;
                do {
                  iVar32 = ((ON_MeshTopologyEdge *)(piVar25 + -1))->m_topvi[0];
                  iVar4 = *piVar25;
                  piVar11 = pOVar19[iVar32].m_topei;
                  iVar6 = pOVar19[iVar32].m_tope_count;
                  pOVar19[iVar32].m_tope_count = iVar6 + 1;
                  piVar11[iVar6] = (int)uVar27;
                  piVar11 = pOVar19[iVar4].m_topei;
                  iVar32 = pOVar19[iVar4].m_tope_count;
                  pOVar19[iVar4].m_tope_count = iVar32 + 1;
                  piVar11[iVar32] = (int)uVar27;
                  uVar27 = uVar27 + 1;
                  piVar25 = piVar25 + 6;
                } while (uVar21 != uVar27);
              }
              ON_SimpleArray<ON_MeshTopologyFace>::SetCapacity(&this->m_topf,new_capacity);
              if ((int)uVar5 <= (this->m_topf).m_capacity) {
                (this->m_topf).m_count = uVar5;
              }
              lVar23 = 0;
              memset((this->m_topf).m_a,0,new_capacity * 0x14);
              uVar27 = 1;
              if (1 < (int)uVar5) {
                uVar27 = new_capacity;
              }
              pOVar31 = (this->m_topf).m_a;
              do {
                puVar2 = (undefined4 *)((long)pOVar31->m_topei + lVar23);
                *puVar2 = 0xffffffff;
                puVar2[1] = 0xffffffff;
                puVar2[2] = 0xffffffff;
                puVar2[3] = 0xffffffff;
                lVar23 = lVar23 + 0x14;
              } while (uVar27 * 0x14 != lVar23);
              if (0 < (int)uVar15) {
                uVar27 = 0;
                do {
                  pOVar20 = (this->m_tope).m_a;
                  if (0 < pOVar20[uVar27].m_topf_count) {
                    pOVar20 = pOVar20 + uVar27;
                    lVar23 = 0;
                    do {
                      iVar32 = pOVar20->m_topfi[lVar23];
                      piVar25 = (this->m_topv_map).m_a;
                      pOVar12 = (this->m_mesh->m_F).m_a;
                      iVar4 = piVar25[pOVar12[iVar32].vi[0]];
                      iVar6 = piVar25[pOVar12[iVar32].vi[1]];
                      iVar10 = piVar25[pOVar12[iVar32].vi[2]];
                      pOVar31 = (this->m_topf).m_a + iVar32;
                      iVar32 = piVar25[pOVar12[iVar32].vi[3]];
                      iVar29 = pOVar20->m_topvi[0];
                      iVar30 = pOVar20->m_topvi[1];
                      iVar16 = (int)uVar27;
                      if ((iVar29 == iVar32) && (iVar30 == iVar4)) {
                        pOVar31->m_topei[0] = iVar16;
                        pOVar31->m_reve[0] = '\0';
                      }
                      else if ((iVar29 == iVar4) && (iVar30 == iVar6)) {
                        pOVar31->m_topei[1] = iVar16;
                        pOVar31->m_reve[1] = '\0';
                      }
                      else if ((iVar29 == iVar6) && (iVar30 == iVar10)) {
                        pOVar31->m_topei[2] = iVar16;
                        pOVar31->m_reve[2] = '\0';
                      }
                      else if ((iVar29 == iVar10) && (iVar30 == iVar32)) {
                        pOVar31->m_topei[3] = iVar16;
                        pOVar31->m_reve[3] = '\0';
                      }
                      else if ((iVar29 == iVar4) && (iVar30 == iVar32)) {
                        pOVar31->m_topei[0] = iVar16;
                        pOVar31->m_reve[0] = '\x01';
                      }
                      else if ((iVar29 == iVar6) && (iVar30 == iVar4)) {
                        pOVar31->m_topei[1] = iVar16;
                        pOVar31->m_reve[1] = '\x01';
                      }
                      else if ((iVar29 == iVar10) && (iVar30 == iVar6)) {
                        pOVar31->m_topei[2] = iVar16;
                        pOVar31->m_reve[2] = '\x01';
                      }
                      else if ((iVar29 == iVar32) && (iVar30 == iVar10)) {
                        pOVar31->m_topei[3] = iVar16;
                        pOVar31->m_reve[3] = '\x01';
                      }
                      lVar23 = lVar23 + 1;
                    } while (lVar23 < pOVar20->m_topf_count);
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar21);
              }
              uVar21 = 1;
              if (1 < (int)uVar5) {
                uVar21 = new_capacity;
              }
              lVar23 = 0xc;
              lVar28 = 0;
              do {
                pOVar31 = (this->m_topf).m_a;
                iVar32 = *(int *)((long)pOVar31->m_topei + lVar23 + -0xc);
                if (((((iVar32 < 0) ||
                      (iVar4 = *(int *)((long)pOVar31->m_topei + lVar23 + -8), iVar4 < 0)) ||
                     (iVar6 = *(int *)((long)pOVar31->m_topei + lVar23 + -4), iVar6 == iVar32)) ||
                    ((iVar4 == iVar6 || (iVar32 == iVar4)))) || (iVar6 < 0)) {
LAB_0050958c:
                  *(undefined1 (*) [16])((long)pOVar31->m_topei + lVar23 + -0xc) =
                       (undefined1  [16])0x0;
                  *(undefined4 *)((long)pOVar31->m_topei + lVar23 + 4) = 0;
                }
                else {
                  pOVar12 = (this->m_mesh->m_F).m_a;
                  if (*(int *)((long)pOVar12->vi + lVar28 + 8) ==
                      *(int *)((long)pOVar12->vi + lVar28 + 0xc)) {
                    *(int *)((long)pOVar31->m_topei + lVar23) = iVar6;
                  }
                  else {
                    iVar10 = *(int *)((long)pOVar31->m_topei + lVar23);
                    if (((iVar6 == iVar10) || (iVar4 == iVar10)) ||
                       ((iVar10 < 0 || (iVar32 == iVar10)))) goto LAB_0050958c;
                  }
                }
                lVar28 = lVar28 + 0x10;
                lVar23 = lVar23 + 0x14;
              } while (uVar21 * 0x10 != lVar28);
            }
            ON_Workspace::~ON_Workspace(&local_40);
            iVar32 = 1;
          }
        }
      }
    }
    if (iVar3 != -1) {
      this->m_b32IsValid = iVar32;
    }
    bVar35 = iVar32 == 1;
    if (!bVar35) {
      Destroy(this);
    }
  }
  return bVar35;
}

Assistant:

bool ON_MeshTopology::Create()
{
  // When -1 == m_b32IsValid, this ON_MeshTopology
  // is the m_top field on an ON_Mesh and is being
  // created in an ON_Mesh::Topology() call and a
  // sleep lock is used to keep ON_Mesh::Topology()
  // thread safe.
  //
  // When 0 == m_b32IsValid, this ON_MeshTopology
  // is being created stand alone.
  //
  // When 1 == m_b32IsValid, this ON_MeshTopology
  // is already created and valid.

  if ( 1 == m_b32IsValid )
    return true;

  const int b32IsValid0 = m_b32IsValid;

  if ( 0 == b32IsValid0 )
  {
    // no sleep lock is being used
    m_b32IsValid = -1;
  }
  int b32IsValid = b32IsValid0;

  while ( 0 == b32IsValid || -1 == b32IsValid ) 
  {
    // while() is for flow control - this is a while() {... break;} statement.
    Destroy();
    b32IsValid = 0;

    // build vertex topology information
    const int fcount = m_mesh->FaceCount();
    const int vcount = m_mesh->VertexCount();
    if ( 0 == vcount )
      break;

    unsigned int* vindex = (unsigned int*)GetIntArray(vcount);
    m_topv_map.SetCapacity( vcount );
    m_topv_map.SetCount( vcount );
    if (  0 == m_mesh->GetVertexLocationIds( 
      0, // first id
      (unsigned int*)m_topv_map.Array(), // vertex ids returned here
      vindex
      ) )
    {
      Destroy();
      break;
    }

    {
      int topv_count = m_topv_map[vindex[vcount-1]]+1;
      m_topv_map.SetCapacity( vcount );
      m_topv_map.SetCount( vcount );
      m_topv.SetCapacity( topv_count );
      int vt0, vt1, topvi;
      for (vt0 = 0; vt0 < vcount; vt0 = vt1)
      {
        topvi = m_topv.Count();
#if defined(ON_DEBUG)
        if ( topvi != m_topv_map[vindex[vt0]] )
        {
          // 20 April 2010 Dale Lear:
          //  If you get this error, save the mesh and tell Dale Lear.
          ON_ERROR("ON_MeshTopology::Create() - topvi != vertex id from GetVertexLocationIds()");
        }
#endif
        ON_MeshTopologyVertex& topv = m_topv.AppendNew();
        topv.m_vi = (const int*)(vindex+vt0);
        for ( vt1=vt0+1; vt1<vcount && topvi == m_topv_map[vindex[vt1]]; vt1++ ) {
          // empty
        }
        topv.m_v_count = vt1-vt0;
      }
    }

    // build edge topology information
    const int topv_count = m_topv.Count();
    if ( topv_count >= 2 ) 
    {
      bool rc = false;
      int ei, ecnt, vi0, vi1, fi, efi, topfvi[4];
      ON_MeshFace f;

      if ( fcount > 0 && vcount > 0 ) 
      {
        // When working on this code be sure to test bug# 9271 and 9254 and file fsv_r4.3dm
        ON_Workspace ws;
        ON_MeshFaceSide* e = (ON_MeshFaceSide*)ws.GetMemory( 4*fcount*sizeof(*e) );
        ecnt = m_mesh->GetMeshFaceSideList( (const unsigned int*)m_topv_map.Array(), e );
        
        if ( ecnt > 0 ) 
        {
          rc = true;
          ON_MeshFaceSide::SortByVertexIndex( e, ecnt );

          // count number of topological edges and allocate storage
          int etop_count = 0;
          ei = 0;
          while( ei < ecnt ) 
          {
            vi0 = e[ei].m_vi[0];
            vi1 = e[ei].m_vi[1];
            ei++;
            while (ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 )
              ei++;
            etop_count++;
          }
          m_tope.SetCapacity(etop_count);

          // fill in the m_tope[] array information
          int* efindex = GetIntArray(ecnt);
          for ( ei = 0; ei < ecnt; /*empty*/ )
          {
            ON_MeshTopologyEdge& tope = m_tope.AppendNew();
            tope.m_topvi[0] = (int)(vi0 = e[ei].m_vi[0]);
            tope.m_topvi[1] = (int)(vi1 = e[ei].m_vi[1]);
            tope.m_topfi = efindex;
            tope.m_topf_count = 0;
            *efindex++ = (int)e[ei].m_fi;
            tope.m_topf_count++;
            ei++;
            while( ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 ) 
            {
              *efindex++ = (int)e[ei].m_fi;
              tope.m_topf_count++;
              ei++;
            }
          }
          efindex = 0; // memory deallocated by ~ON_MeshTopology()

          // connect vertices to edges;
          ecnt = m_tope.Count();
          int* ve_count = (int*)onmalloc(topv_count*sizeof(*ve_count));
          // set ve_count[topvi] = number of edges that begin or end at m_topv[topvi]
          memset( ve_count, 0, topv_count*sizeof(*ve_count));
          for ( ei = 0; ei < ecnt; ei++ ) {
            const ON_MeshTopologyEdge& tope = m_tope[ei];
            ve_count[tope.m_topvi[0]]++;
            ve_count[tope.m_topvi[1]]++;
          }
          // allocate and distribute storage for the mopv.m_topei[] array
          int* vei = GetIntArray(2*ecnt);
          for ( vi0 = 0; vi0 < topv_count; vi0++ ) {
            ON_MeshTopologyVertex& topv = m_topv[vi0];
            if ( ve_count[vi0] > 0 ) {
              topv.m_topei = vei;
              vei += ve_count[vi0];
            }
          }
          onfree(ve_count); ve_count = 0;
          vei = 0; // memory deallocated by ~ON_MeshTopology()

          // fill in the m_topv[].m_topei[] values
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
            ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
            vei = const_cast<int*>(topv0.m_topei);
            vei[topv0.m_tope_count++] = ei;
            vei = const_cast<int*>(topv1.m_topei);
            vei[topv1.m_tope_count++] = ei;
          }

          // build face topology information
          m_topf.SetCapacity(fcount);
          m_topf.SetCount(fcount);
          memset( m_topf.Array(), 0, fcount*sizeof(ON_MeshTopologyFace) );
          for ( fi = 0; fi < fcount; fi++ ) {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            f_local.m_topei[0] = -1;
            f_local.m_topei[1] = -1;
            f_local.m_topei[2] = -1;
            f_local.m_topei[3] = -1;
          }
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            for (efi = 0; efi < tope.m_topf_count; efi++ ) {
              // Because ON_MeshFace.vi[2] == ON_MeshFace.vi[3] for triangles,
              // we have topf.m_topei[j] BEGIN at ON_MeshFace.vi[(j+3)%4] and END at ON_MeshFace.vi[j]
              fi = tope.m_topfi[efi];
              f = m_mesh->m_F[fi];
              topfvi[0] = m_topv_map[f.vi[0]];
              topfvi[1] = m_topv_map[f.vi[1]];
              topfvi[2] = m_topv_map[f.vi[2]];
              topfvi[3] = m_topv_map[f.vi[3]];
              ON_MeshTopologyFace& topf = m_topf[fi];
              vi0 = tope.m_topvi[0];
              vi1 = tope.m_topvi[1];
              // unroll loop for speed
              if      ( vi0 == topfvi[3] && vi1 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 0;
              }
              else if ( vi0 == topfvi[0] && vi1 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 0;
              }
              else if ( vi0 == topfvi[1] && vi1 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 0;
              }
              else if ( vi0 == topfvi[2] && vi1 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 0;
              }
              else if ( vi1 == topfvi[3] && vi0 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 1;
              }
              else if ( vi1 == topfvi[0] && vi0 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 1;
              }
              else if ( vi1 == topfvi[1] && vi0 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 1;
              }
              else if ( vi1 == topfvi[2] && vi0 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 1;
              }
            }
          }
          for ( fi = 0; fi < fcount; fi++ ) 
          {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            bool bIsGood = false;
            if (    f_local.m_topei[0] >= 0 && f_local.m_topei[1] >= 0 && f_local.m_topei[2] >=0 
                 && f_local.m_topei[0] != f_local.m_topei[1] 
                 && f_local.m_topei[1] != f_local.m_topei[2] 
                 && f_local.m_topei[2] != f_local.m_topei[0] 
                 ) {
              if ( m_mesh->m_F[fi].IsTriangle() ) {
                bIsGood = true;
                f_local.m_topei[3] = f_local.m_topei[2];
              }
              else if (   f_local.m_topei[3] >= 0 
                       && f_local.m_topei[0] != f_local.m_topei[3] 
                       && f_local.m_topei[1] != f_local.m_topei[3] 
                       && f_local.m_topei[2] != f_local.m_topei[3] ) {
                bIsGood = true;
              }
            }
            if ( !bIsGood ) {
              f_local.m_topei[0] = 0;
              f_local.m_topei[1] = 0;
              f_local.m_topei[2] = 0;
              f_local.m_topei[3] = 0;
              f_local.m_reve[0] = 0;
              f_local.m_reve[1] = 0;
              f_local.m_reve[2] = 0;
              f_local.m_reve[3] = 0;
            }
          }

        }
      }
    }

    b32IsValid = 1;
    break;
  }

  if ( -1 != b32IsValid0 )
  {
    // no sleep lock is in use
    m_b32IsValid = b32IsValid;
  }

  if ( 1 != b32IsValid )
  {
    Destroy();
  }

  return (1 == b32IsValid);
}